

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

int testing::internal::posix::IsATTY(int fd)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int isAttyValue;
  int savedErrno;
  int fd_local;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  iVar2 = DoIsATTY(fd);
  piVar3 = __errno_location();
  *piVar3 = iVar1;
  return iVar2;
}

Assistant:

inline int IsATTY(int fd) {
  // DoIsATTY might change errno (for example ENOTTY in case you redirect stdout
  // to a file on Linux), which is unexpected, so save the previous value, and
  // restore it after the call.
  int savedErrno = errno;
  int isAttyValue = DoIsATTY(fd);
  errno = savedErrno;

  return isAttyValue;
}